

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
randomx::AssemblyGeneratorX86::h_FSUB_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  ostream *poVar1;
  
  instr->dst = instr->dst & 3;
  instr->src = instr->src & 3;
  poVar1 = std::operator<<((ostream *)&this->field_0x10,"\tsubpd ");
  poVar1 = std::operator<<(poVar1,*(char **)(regF + (ulong)instr->dst * 8));
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,*(char **)(regA + (ulong)instr->src * 8));
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_FSUB_R(Instruction& instr, int i) {
		instr.dst %= RegisterCountFlt;
		instr.src %= RegisterCountFlt;
		asmCode << "\tsubpd " << regF[instr.dst] << ", " << regA[instr.src] << std::endl;
		traceflt(instr);
	}